

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5MultiIterAdvanceRowid(Fts5Iter *pIter,int iChanged,Fts5SegIter **ppFirst)

{
  i64 iVar1;
  Fts5CResult *pRes;
  Fts5SegIter *pOther;
  int i;
  Fts5SegIter *pNew;
  Fts5SegIter **ppFirst_local;
  int iChanged_local;
  Fts5Iter *pIter_local;
  
  pNew = pIter->aSeg + iChanged;
  if ((pNew->iRowid == pIter->iSwitchRowid) ||
     ((uint)(pNew->iRowid < pIter->iSwitchRowid) == pIter->bRev)) {
    pOther = pIter->aSeg + (int)(iChanged ^ 1);
    iVar1 = 0x7fffffffffffffff;
    if (pIter->bRev != 0) {
      iVar1 = -0x8000000000000000;
    }
    pIter->iSwitchRowid = iVar1;
    i = pIter->nSeg + iChanged;
    while( true ) {
      i = i / 2;
      if (pIter->aFirst[i].bTermEq != '\0') {
        if (pNew->iRowid == pOther->iRowid) {
          return 1;
        }
        if ((uint)(pNew->iRowid < pOther->iRowid) == pIter->bRev) {
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }
        else if ((uint)(pIter->iSwitchRowid < pOther->iRowid) == pIter->bRev) {
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pIter->aFirst[i].iFirst = (u16)((long)pNew - (long)pIter->aSeg >> 7);
      if (i == 1) break;
      pOther = pIter->aSeg + pIter->aFirst[(int)(i ^ 1)].iFirst;
    }
  }
  *ppFirst = pNew;
  return 0;
}

Assistant:

static int fts5MultiIterAdvanceRowid(
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  Fts5SegIter **ppFirst
){
  Fts5SegIter *pNew = &pIter->aSeg[iChanged];

  if( pNew->iRowid==pIter->iSwitchRowid
   || (pNew->iRowid<pIter->iSwitchRowid)==pIter->bRev
  ){
    int i;
    Fts5SegIter *pOther = &pIter->aSeg[iChanged ^ 0x0001];
    pIter->iSwitchRowid = pIter->bRev ? SMALLEST_INT64 : LARGEST_INT64;
    for(i=(pIter->nSeg+iChanged)/2; 1; i=i/2){
      Fts5CResult *pRes = &pIter->aFirst[i];

      assert( pNew->pLeaf );
      assert( pRes->bTermEq==0 || pOther->pLeaf );

      if( pRes->bTermEq ){
        if( pNew->iRowid==pOther->iRowid ){
          return 1;
        }else if( (pOther->iRowid>pNew->iRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
          pNew = pOther;
        }else if( (pOther->iRowid>pIter->iSwitchRowid)==pIter->bRev ){
          pIter->iSwitchRowid = pOther->iRowid;
        }
      }
      pRes->iFirst = (u16)(pNew - pIter->aSeg);
      if( i==1 ) break;

      pOther = &pIter->aSeg[ pIter->aFirst[i ^ 0x0001].iFirst ];
    }
  }

  *ppFirst = pNew;
  return 0;
}